

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation_tests.cpp
# Opt level: O2

void __thiscall
translation_tests::translation_namedparams::test_method(translation_namedparams *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  bilingual_str *pbVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined **local_138;
  undefined1 local_130;
  undefined1 *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  bilingual_str result;
  bilingual_str format;
  bilingual_str arg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg,"original",(allocator<char> *)&format);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg.translated,"translated",(allocator<char> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&format,"original [%s]",(allocator<char> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&format.translated,"translated [%s]",(allocator<char> *)&local_138);
  tinyformat::format<bilingual_str>(&result,&format,&arg);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/translation_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x11;
  file.m_begin = (iterator)&local_108;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_01139f30;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/translation_tests.cpp"
  ;
  local_140 = "";
  pvVar2 = (iterator)0x2;
  pbVar3 = &result;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[20]>
            (&local_138,&local_148,0x11,1,2,pbVar3,"result.original","original [original]",
             "\"original [original]\"");
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/translation_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pbVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x12;
  file_00.m_begin = (iterator)&local_158;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
             msg_00);
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_01139f30;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/translation_tests.cpp"
  ;
  local_170 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[24]>
            (&local_138,&local_178,0x12,1,2,&result.translated,"result.translated",
             "translated [translated]","\"translated [translated]\"");
  bilingual_str::~bilingual_str(&result);
  bilingual_str::~bilingual_str(&format);
  bilingual_str::~bilingual_str(&arg);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(translation_namedparams)
{
    bilingual_str arg{"original", "translated"};
    bilingual_str format{"original [%s]", "translated [%s]"};
    bilingual_str result{strprintf(format, arg)};
    BOOST_CHECK_EQUAL(result.original, "original [original]");
    BOOST_CHECK_EQUAL(result.translated, "translated [translated]");
}